

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O3

void __thiscall
tchecker::zg::details::local_m_extrapolation_t::local_m_extrapolation_t
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  map_t *pmVar2;
  
  (this->super_extrapolation_t)._vptr_extrapolation_t =
       (_func_int **)&PTR__local_m_extrapolation_t_0021c1a8;
  this->_m = (map_t *)0x0;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (e->_clock_bounds).
         super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  p_Var1 = (e->_clock_bounds).
           super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->_clock_bounds).
  super___shared_ptr<const_tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  pmVar2 = clockbounds::clone_map(e->_m);
  this->_m = pmVar2;
  return;
}

Assistant:

local_m_extrapolation_t::local_m_extrapolation_t(tchecker::zg::details::local_m_extrapolation_t const & e)
    : _m(nullptr), _clock_bounds(e._clock_bounds)
{
  _m = tchecker::clockbounds::clone_map(*e._m);
}